

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

bool capnp::IncomingRpcMessage::isShortLivedRpcMessage(Reader body)

{
  Which WVar1;
  ReaderFor<capnp::rpc::Message> local_40;
  
  AnyPointer::Reader::getAs<capnp::rpc::Message>(&local_40,(Reader *)&stack0x00000008);
  WVar1 = rpc::Message::Reader::which(&local_40);
  return WVar1 != CALL && WVar1 != RETURN;
}

Assistant:

bool IncomingRpcMessage::isShortLivedRpcMessage(AnyPointer::Reader body) {
  switch (body.getAs<rpc::Message>().which()) {
    case rpc::Message::CALL:
    case rpc::Message::RETURN:
      return false;
    default:
      return true;
  }
}